

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::adjustFieldTypes
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *pattern,PtnSkeleton *specifiedSkeleton,int32_t flags,
          UDateTimePatternMatchOptions options)

{
  char cVar1;
  uint uVar2;
  DateTimeMatcher *pDVar3;
  ushort uVar4;
  UBool UVar5;
  char16_t ch;
  uint uVar6;
  char16_t cVar7;
  int32_t j;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  int local_d8;
  UDateTimePatternMatchOptions local_d4;
  UDateTimePatternMatchOptions local_d0;
  UDateTimePatternMatchOptions local_cc;
  PtnSkeleton *local_c8;
  UnicodeString *local_c0;
  UObject local_b8;
  UnicodeString field;
  UnicodeString quoteLiteral;
  
  local_b8._vptr_UObject = (_func_int **)&PTR__UnicodeString_00471e80;
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_c8 = specifiedSkeleton;
  FormatParser::set(this->fp,pattern);
  local_c0 = &this->decimal;
  iVar10 = 0;
  local_d0 = options & UDATPG_MATCH_SECOND_FIELD_LENGTH;
  local_d4 = options & UDATPG_MATCH_MINUTE_FIELD_LENGTH;
  local_cc = options & UDATPG_MATCH_HOUR_FIELD_LENGTH;
  do {
    if (this->fp->itemNumber <= iVar10) {
      return __return_storage_ptr__;
    }
    local_d8 = iVar10;
    icu_63::UnicodeString::UnicodeString
              (&field,(UnicodeString *)(&this->fp->field_0x8 + (long)iVar10 * 0x40));
    UVar5 = FormatParser::isQuoteLiteral(&field);
    if (UVar5 == '\0') {
      UVar5 = FormatParser::isPatternSeparator(this->fp,&field);
      if (UVar5 == '\0') {
        uVar6 = FormatParser::getCanonicalIndex(&field);
        if ((int)uVar6 < 0) {
          icu_63::UnicodeString::operator+=(__return_storage_ptr__,&field);
        }
        else {
          uVar2 = *(uint *)(&DAT_003810c4 + (ulong)uVar6 * 0x10);
          if (((flags & 1U) == 0) || (uVar2 != 0xd)) {
            pDVar3 = this->dtMatcher;
            if ((pDVar3->skeleton).type[(int)uVar2] != 0) {
              cVar1 = (pDVar3->skeleton).original.chars[(int)uVar2];
              ch = (char16_t)cVar1;
              iVar9 = (int)(pDVar3->skeleton).original.lengths[(int)uVar2];
              uVar8 = 3;
              if (3 < iVar9) {
                uVar8 = iVar9;
              }
              if (cVar1 != 'E') {
                uVar8 = iVar9;
              }
              if (((uVar2 == 0xb && local_cc == UDATPG_MATCH_NO_OPTIONS) ||
                  (uVar2 == 0xc && local_d4 == UDATPG_MATCH_NO_OPTIONS)) ||
                 (uVar2 == 0xd && local_d0 == UDATPG_MATCH_NO_OPTIONS)) {
LAB_002d5e25:
                uVar8 = field.fUnion.fFields.fLength;
                if (-1 < field.fUnion.fStackFields.fLengthAndFlags) {
                  uVar8 = (int)field.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
              }
              else if (local_c8 != (PtnSkeleton *)0x0) {
                if (((uVar8 == (int)(local_c8->original).lengths[(int)uVar2]) ||
                    (0 < *(short *)(&DAT_003810c8 + (ulong)uVar6 * 0x10) &&
                     local_c8->type[(int)uVar2] < 1)) ||
                   (0 < local_c8->type[(int)uVar2] &&
                    *(short *)(&DAT_003810c8 + (ulong)uVar6 * 0x10) < 1)) goto LAB_002d5e25;
              }
              if (((uVar2 < 0xc) && ((0x848U >> (uVar2 & 0x1f) & 1) != 0)) ||
                 ((uVar2 == 1 && (cVar1 != 'Y')))) {
                ch = icu_63::UnicodeString::doCharAt(&field,0);
              }
              cVar7 = ch;
              if (uVar2 == 0xb) {
                cVar7 = this->fDefaultHourFormatChar;
              }
              if ((flags & 2U) != 0) {
                ch = cVar7;
              }
              uVar4 = field.fUnion.fStackFields.fLengthAndFlags & 1;
              field.fUnion.fStackFields.fLengthAndFlags =
                   field.fUnion.fStackFields.fLengthAndFlags & 0x1e;
              if (uVar4 != 0) {
                field.fUnion.fStackFields.fLengthAndFlags = 2;
              }
              for (; 0 < (int)uVar8; uVar8 = uVar8 + -1) {
                icu_63::UnicodeString::operator+=(&field,ch);
              }
            }
          }
          else {
            icu_63::UnicodeString::operator+=(&field,local_c0);
            SkeletonFields::appendFieldTo(&(this->dtMatcher->skeleton).original,0xe,&field);
          }
          icu_63::UnicodeString::operator+=(__return_storage_ptr__,&field);
        }
      }
      else {
        icu_63::UnicodeString::operator+=(__return_storage_ptr__,&field);
      }
    }
    else {
      quoteLiteral.super_Replaceable.super_UObject._vptr_UObject =
           (UObject)(UObject)local_b8._vptr_UObject;
      quoteLiteral.fUnion.fStackFields.fLengthAndFlags = 2;
      FormatParser::getQuoteLiteral(this->fp,&quoteLiteral,&local_d8);
      icu_63::UnicodeString::operator+=(__return_storage_ptr__,&quoteLiteral);
      icu_63::UnicodeString::~UnicodeString(&quoteLiteral);
      iVar10 = local_d8;
    }
    icu_63::UnicodeString::~UnicodeString(&field);
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

UnicodeString
DateTimePatternGenerator::adjustFieldTypes(const UnicodeString& pattern,
                                           const PtnSkeleton* specifiedSkeleton,
                                           int32_t flags,
                                           UDateTimePatternMatchOptions options) {
    UnicodeString newPattern;
    fp->set(pattern);
    for (int32_t i=0; i < fp->itemNumber; i++) {
        UnicodeString field = fp->items[i];
        if ( fp->isQuoteLiteral(field) ) {

            UnicodeString quoteLiteral;
            fp->getQuoteLiteral(quoteLiteral, &i);
            newPattern += quoteLiteral;
        }
        else {
            if (fp->isPatternSeparator(field)) {
                newPattern+=field;
                continue;
            }
            int32_t canonicalIndex = fp->getCanonicalIndex(field);
            if (canonicalIndex < 0) {
                newPattern+=field;
                continue;  // don't adjust
            }
            const dtTypeElem *row = &dtTypes[canonicalIndex];
            int32_t typeValue = row->field;

            // handle day periods - with #13183, no longer need special handling here, integrated with normal types

            if ((flags & kDTPGFixFractionalSeconds) != 0 && typeValue == UDATPG_SECOND_FIELD) {
                field += decimal;
                dtMatcher->skeleton.original.appendFieldTo(UDATPG_FRACTIONAL_SECOND_FIELD, field);
            } else if (dtMatcher->skeleton.type[typeValue]!=0) {
                    // Here:
                    // - "reqField" is the field from the originally requested skeleton, with length
                    // "reqFieldLen".
                    // - "field" is the field from the found pattern.
                    //
                    // The adjusted field should consist of characters from the originally requested
                    // skeleton, except in the case of UDATPG_HOUR_FIELD or UDATPG_MONTH_FIELD or
                    // UDATPG_WEEKDAY_FIELD or UDATPG_YEAR_FIELD, in which case it should consist
                    // of characters from the  found pattern.
                    //
                    // The length of the adjusted field (adjFieldLen) should match that in the originally
                    // requested skeleton, except that in the following cases the length of the adjusted field
                    // should match that in the found pattern (i.e. the length of this pattern field should
                    // not be adjusted):
                    // 1. typeValue is UDATPG_HOUR_FIELD/MINUTE/SECOND and the corresponding bit in options is
                    //    not set (ticket #7180). Note, we may want to implement a similar change for other
                    //    numeric fields (MM, dd, etc.) so the default behavior is to get locale preference for
                    //    field length, but options bits can be used to override this.
                    // 2. There is a specified skeleton for the found pattern and one of the following is true:
                    //    a) The length of the field in the skeleton (skelFieldLen) is equal to reqFieldLen.
                    //    b) The pattern field is numeric and the skeleton field is not, or vice versa.

                    UChar reqFieldChar = dtMatcher->skeleton.original.getFieldChar(typeValue);
                    int32_t reqFieldLen = dtMatcher->skeleton.original.getFieldLength(typeValue);
                    if (reqFieldChar == CAP_E && reqFieldLen < 3)
                        reqFieldLen = 3; // 1-3 for E are equivalent to 3 for c,e
                    int32_t adjFieldLen = reqFieldLen;
                    if ( (typeValue==UDATPG_HOUR_FIELD && (options & UDATPG_MATCH_HOUR_FIELD_LENGTH)==0) ||
                         (typeValue==UDATPG_MINUTE_FIELD && (options & UDATPG_MATCH_MINUTE_FIELD_LENGTH)==0) ||
                         (typeValue==UDATPG_SECOND_FIELD && (options & UDATPG_MATCH_SECOND_FIELD_LENGTH)==0) ) {
                         adjFieldLen = field.length();
                    } else if (specifiedSkeleton) {
                        int32_t skelFieldLen = specifiedSkeleton->original.getFieldLength(typeValue);
                        UBool patFieldIsNumeric = (row->type > 0);
                        UBool skelFieldIsNumeric = (specifiedSkeleton->type[typeValue] > 0);
                        if (skelFieldLen == reqFieldLen || (patFieldIsNumeric && !skelFieldIsNumeric) || (skelFieldIsNumeric && !patFieldIsNumeric)) {
                            // don't adjust the field length in the found pattern
                            adjFieldLen = field.length();
                        }
                    }
                    UChar c = (typeValue!= UDATPG_HOUR_FIELD
                            && typeValue!= UDATPG_MONTH_FIELD
                            && typeValue!= UDATPG_WEEKDAY_FIELD
                            && (typeValue!= UDATPG_YEAR_FIELD || reqFieldChar==CAP_Y))
                            ? reqFieldChar
                            : field.charAt(0);
                    if (typeValue == UDATPG_HOUR_FIELD && (flags & kDTPGSkeletonUsesCapJ) != 0) {
                        c = fDefaultHourFormatChar;
                    }
                    field.remove();
                    for (int32_t j=adjFieldLen; j>0; --j) {
                        field += c;
                    }
            }
            newPattern+=field;
        }
    }
    return newPattern;
}